

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeGeneric::MultiplyTandAdd
          (ChConstraintThreeGeneric *this,ChVectorDynamic<double> *result,double l)

{
  double local_90;
  ChRowVectorDynamic<double> *local_88;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_80;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> local_58 [56];
  
  local_90 = l;
  if (((this->super_ChConstraintThree).variables_a)->disabled == false) {
    local_88 = &this->Cq_a;
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>>>::operator*
              (&local_80,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>> *)&local_88,
               &local_90);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_58,result,
               (long)((this->super_ChConstraintThree).variables_a)->offset,
               (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
               .m_cols);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                         *)&local_80);
  }
  if (((this->super_ChConstraintThree).variables_b)->disabled == false) {
    local_88 = &this->Cq_b;
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>>>::operator*
              (&local_80,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>> *)&local_88,
               &local_90);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_58,result,
               (long)((this->super_ChConstraintThree).variables_b)->offset,
               (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
               .m_cols);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                         *)&local_80);
  }
  if (((this->super_ChConstraintThree).variables_c)->disabled == false) {
    local_88 = &this->Cq_c;
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>>>::operator*
              (&local_80,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>> *)&local_88,
               &local_90);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_58,result,
               (long)((this->super_ChConstraintThree).variables_c)->offset,
               (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
               .m_cols);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                         *)&local_80);
  }
  return;
}

Assistant:

void ChConstraintThreeGeneric::MultiplyTandAdd(ChVectorDynamic<double>& result, double l) {
    if (variables_a->IsActive()) {
        result.segment(variables_a->GetOffset(), Cq_a.size()) += Cq_a.transpose() * l;
    }

    if (variables_b->IsActive()) {
        result.segment(variables_b->GetOffset(), Cq_b.size()) += Cq_b.transpose() * l;
    }

    if (variables_c->IsActive()) {
        result.segment(variables_c->GetOffset(), Cq_c.size()) += Cq_c.transpose() * l;
    }
}